

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionCompiler.hpp
# Opt level: O0

bool __thiscall OpenMD::SelectionCompiler::compileError(SelectionCompiler *this,string *errorMsg)

{
  undefined8 uVar1;
  string *in_RSI;
  long in_RDI;
  
  uVar1 = std::__cxx11::string::c_str();
  snprintf(painCave.errMsg,2000,"SelectionCompiler Error: %s\n",uVar1);
  painCave.severity = 1;
  painCave.isFatal = 1;
  simError();
  *(undefined1 *)(in_RDI + 0x88) = 1;
  std::__cxx11::string::operator=((string *)(in_RDI + 0x90),in_RSI);
  return false;
}

Assistant:

bool compileError(const std::string& errorMsg) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "SelectionCompiler Error: %s\n", errorMsg.c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();

      error              = true;
      this->errorMessage = errorMsg;
      return false;
    }